

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TRemapIdTraverser::visitSymbol(TRemapIdTraverser *this,TIntermSymbol *symbol)

{
  TIdMaps *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  TString *__k;
  const_iterator cVar4;
  uint extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar5;
  ulong uVar6;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar2));
  uVar5 = (uint)*(ulong *)(lVar3 + 8) & 0x7f;
  if (((uVar5 - 3 < 5) || (uVar5 == 1)) || ((*(ulong *)(lVar3 + 8) & 0xff80) != 0)) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar3 = 3;
    if ((*(char *)(CONCAT44(extraout_var_00,iVar2) + 8) == '\x10') &&
       (uVar5 = (*(uint *)(CONCAT44(extraout_var_00,iVar2) + 0x18) & 0x7f) - 3, uVar5 < 4)) {
      lVar3 = *(long *)(&DAT_0084dc68 + (ulong)uVar5 * 8);
    }
    pTVar1 = this->idMaps;
    __k = getNameForIdMap_abi_cxx11_(symbol);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                    *)(pTVar1->maps + lVar3),__k);
    if ((_Rb_tree_header *)cVar4._M_node !=
        &this->idMaps->maps[lVar3].
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      uVar6 = (ulong)cVar4._M_node[2]._M_parent & 0xffffffffffffff |
              ((ulong)extraout_var_01 & 0xff000000) << 0x20;
      goto LAB_003f888c;
    }
  }
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  uVar6 = CONCAT44(extraout_var_02,iVar2) + this->idShift;
LAB_003f888c:
  (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x31])(symbol,uVar6);
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
    {
        const TQualifier& qualifier = symbol->getType().getQualifier();
        bool remapped = false;
        if (qualifier.isLinkable() || qualifier.builtIn != EbvNone) {
            TShaderInterface si = symbol->getType().getShaderInterface();
            auto it = idMaps[si].find(getNameForIdMap(symbol));
            if (it != idMaps[si].end()) {
                uint64_t id = (symbol->getId() & ~TSymbolTable::uniqueIdMask) |
                    (it->second & TSymbolTable::uniqueIdMask);
                symbol->changeId(id);
                remapped = true;
            }
        }
        if (!remapped)
            symbol->changeId(symbol->getId() + idShift);
    }